

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O0

int __thiscall
mcts::RandomPlayout<ttt::Board>::operator()(RandomPlayout<ttt::Board> *this,Board *game)

{
  int iVar1;
  undefined8 *in_RSI;
  vector<long,_std::allocator<long>_> moves;
  int status;
  Board ngame;
  int in_stack_ffffffffffffff98;
  result_type_conflict1 in_stack_ffffffffffffff9c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffffa0;
  vector<long,_std::allocator<long>_> *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  result_type in_stack_ffffffffffffffac;
  Board *in_stack_ffffffffffffffb0;
  vector<long,_std::allocator<long>_> local_48;
  int local_2c;
  undefined2 in_stack_ffffffffffffffd8;
  undefined6 uVar2;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (operator()(ttt::Board_const&)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(ttt::Board_const&)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device
                ((random_device *)
                 CONCAT44(in_stack_ffffffffffffffe4,
                          CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)));
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(ttt::Board_const&)::rd);
    }
  }
  if (operator()(ttt::Board_const&)::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(ttt::Board_const&)::gen);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffac = std::random_device::operator()((random_device *)0x207152);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine
                (in_stack_ffffffffffffffa0,
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      __cxa_guard_release(&operator()(ttt::Board_const&)::gen);
    }
  }
  uVar2 = (undefined6)*in_RSI;
  local_2c = ttt::Board::GetStatus((Board *)0x20719a);
  while (local_2c == -1) {
    this_00 = &local_48;
    ttt::Board::GetPossibleMoves((Board *)CONCAT62(uVar2,in_stack_ffffffffffffffd8));
    std::vector<long,_std::allocator<long>_>::size(this_00);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)this_00,in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff9c =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)this_00,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::vector<long,_std::allocator<long>_>::operator[](&local_48,(long)in_stack_ffffffffffffff9c);
    ttt::Board::ApplyMove
              (in_stack_ffffffffffffffb0,
               (IMove *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffff98 = ttt::Board::GetStatus((Board *)0x20721a);
    local_2c = in_stack_ffffffffffffff98;
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffffb0);
  }
  return local_2c;
}

Assistant:

int
RandomPlayout<IGame>::operator()(const IGame &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        auto moves = ngame.GetPossibleMoves();
        ngame.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        status = ngame.GetStatus();
    }
    return status;
}